

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# humain.cpp
# Opt level: O2

void free(void *__ptr)

{
  hu_recursion_checker recursion_checker;
  
  if (hu_bypass) {
    __libc_free(__ptr);
  }
  else {
    hu_recursion_checker::hu_recursion_checker(&recursion_checker);
    if (hu_callcount < 2) {
      if (hu_enable_humalloc == true) {
        hu_free(__ptr);
      }
      else {
        __libc_free(__ptr);
      }
      log_event(2,__ptr,0);
    }
    else {
      __libc_free(__ptr);
    }
    hu_recursion_checker::~hu_recursion_checker(&recursion_checker);
  }
  return;
}

Assistant:

void free(void* ptr)
{
  if (hu_bypass) return __libc_free(ptr);

  hu_recursion_checker recursion_checker;
  if (recursion_checker.is_recursive_call()) return __libc_free(ptr);

  hu_enable_humalloc ? hu_free(ptr) : __libc_free(ptr);
  log_event(EVENT_FREE, ptr, 0);
}